

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O1

CONCRETE_IO_HANDLE saslclientio_create(void *io_create_parameters)

{
  long lVar1;
  long *callback_context;
  FRAME_CODEC_HANDLE frame_codec;
  SASL_FRAME_CODEC_HANDLE pSVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  
  if (io_create_parameters == (void *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar5 = "NULL io_create_parameters";
      iVar4 = 0x3c8;
LAB_00117eaf:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                ,"saslclientio_create",iVar4,1,pcVar5);
      return (CONCRETE_IO_HANDLE)0x0;
    }
  }
  else {
    lVar1 = *io_create_parameters;
    if ((lVar1 == 0) || (*(long *)((long)io_create_parameters + 8) == 0)) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar5 = "Bad parameters: underlying_io = %p, sasl_mechanism = %p";
        iVar4 = 0x3d0;
        goto LAB_00117eaf;
      }
    }
    else {
      callback_context = (long *)calloc(1,0x80);
      if (callback_context == (long *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "Cannot allocate sasl client IO instance";
          iVar4 = 0x3d9;
          goto LAB_00117eaf;
        }
      }
      else {
        *callback_context = lVar1;
        frame_codec = frame_codec_create(on_frame_codec_error,callback_context);
        callback_context[0xc] = (long)frame_codec;
        if (frame_codec == (FRAME_CODEC_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                      ,"saslclientio_create",0x3e3,1,"frame_codec_create failed");
          }
        }
        else {
          pSVar2 = sasl_frame_codec_create
                             (frame_codec,on_sasl_frame_received_callback,on_sasl_frame_codec_error,
                              callback_context);
          callback_context[0xb] = (long)pSVar2;
          if (pSVar2 != (SASL_FRAME_CODEC_HANDLE)0x0) {
            callback_context[7] = 0;
            callback_context[8] = 0;
            callback_context[5] = 0;
            callback_context[6] = 0;
            callback_context[3] = 0;
            callback_context[4] = 0;
            callback_context[1] = 0;
            callback_context[2] = 0;
            callback_context[0xe] = *(long *)((long)io_create_parameters + 8);
            *(undefined4 *)(callback_context + 0xd) = 0;
            return callback_context;
          }
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                      ,"saslclientio_create",0x3ee,1,"sasl_frame_codec_create failed");
          }
          frame_codec_destroy((FRAME_CODEC_HANDLE)callback_context[0xc]);
        }
        free(callback_context);
      }
    }
  }
  return (CONCRETE_IO_HANDLE)0x0;
}

Assistant:

CONCRETE_IO_HANDLE saslclientio_create(void* io_create_parameters)
{
    SASLCLIENTIO_CONFIG* sasl_client_io_config = (SASLCLIENTIO_CONFIG*)io_create_parameters;
    SASL_CLIENT_IO_INSTANCE* result;

    /* Codes_SRS_SASLCLIENTIO_01_005: [If `io_create_parameters` is NULL, `saslclientio_create` shall fail and return NULL.] */
    if (sasl_client_io_config == NULL)
    {
        LogError("NULL io_create_parameters");
        result = NULL;
    }
    /* Codes_SRS_SASLCLIENTIO_01_092: [If any of the `sasl_mechanism` or `underlying_io` members of the configuration structure are NULL, `saslclientio_create` shall fail and return NULL.] */
    else if ((sasl_client_io_config->underlying_io == NULL) ||
        (sasl_client_io_config->sasl_mechanism == NULL))
    {
        LogError("Bad parameters: underlying_io = %p, sasl_mechanism = %p",
            sasl_client_io_config->underlying_io, sasl_client_io_config->sasl_mechanism);
        result = NULL;
    }
    else
    {
        result = (SASL_CLIENT_IO_INSTANCE*)calloc(1, sizeof(SASL_CLIENT_IO_INSTANCE));
        if (result == NULL)
        {
            /* Codes_SRS_SASLCLIENTIO_01_006: [If memory cannot be allocated for the new instance, `saslclientio_create` shall fail and return NULL.] */
            LogError("Cannot allocate sasl client IO instance");
        }
        else
        {
            result->underlying_io = sasl_client_io_config->underlying_io;
            /* Codes_SRS_SASLCLIENTIO_01_089: [`saslclientio_create` shall create a frame codec to be used for encoding/decoding frames by calling `frame_codec_create` and passing `on_frame_codec_error` and a context as arguments.] */
            result->frame_codec = frame_codec_create(on_frame_codec_error, result);
            if (result->frame_codec == NULL)
            {
                /* Codes_SRS_SASLCLIENTIO_01_090: [If `frame_codec_create` fails, then `saslclientio_create` shall fail and return NULL.] */
                LogError("frame_codec_create failed");
                free(result);
                result = NULL;
            }
            else
            {
                /* Codes_SRS_SASLCLIENTIO_01_084: [`saslclientio_create` shall create a SASL frame codec to be used for SASL frame encoding/decoding by calling `sasl_frame_codec_create` and passing the just created frame codec as argument.] */
                result->sasl_frame_codec = sasl_frame_codec_create(result->frame_codec, on_sasl_frame_received_callback, on_sasl_frame_codec_error, result);
                if (result->sasl_frame_codec == NULL)
                {
                    /* Codes_SRS_SASLCLIENTIO_01_085: [If `sasl_frame_codec_create` fails, then `saslclientio_create` shall fail and return NULL.] */
                    LogError("sasl_frame_codec_create failed");
                    frame_codec_destroy(result->frame_codec);
                    free(result);
                    result = NULL;
                }
                else
                {
                    /* Codes_SRS_SASLCLIENTIO_01_004: [`saslclientio_create` shall return on success a non-NULL handle to a new SASL client IO instance.] */
                    result->on_bytes_received = NULL;
                    result->on_io_open_complete = NULL;
                    result->on_io_error = NULL;
                    result->on_io_close_complete = NULL;
                    result->on_bytes_received_context = NULL;
                    result->on_io_open_complete_context = NULL;
                    result->on_io_close_complete_context = NULL;
                    result->on_io_error_context = NULL;
                    result->sasl_mechanism = sasl_client_io_config->sasl_mechanism;

                    result->io_state = IO_STATE_NOT_OPEN;
                }
            }
        }
    }

    return result;
}